

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerObjectGraphDumper.cpp
# Opt level: O0

void __thiscall
Memory::RecyclerObjectGraphDumper::RecyclerObjectGraphDumper
          (RecyclerObjectGraphDumper *this,Recycler *recycler,Param *param)

{
  Param *param_local;
  Recycler *recycler_local;
  RecyclerObjectGraphDumper *this_local;
  
  this->recycler = recycler;
  this->param = param;
  this->dumpObjectName = (char16 *)0x0;
  this->dumpObject = (void *)0x0;
  this->dumpObjectTypeInfo = (type_info *)0x0;
  this->isOutOfMemory = false;
  recycler->objectGraphDumper = this;
  return;
}

Assistant:

RecyclerObjectGraphDumper::RecyclerObjectGraphDumper(Recycler * recycler, RecyclerObjectGraphDumper::Param * param) :
    recycler(recycler),
    param(param),
    dumpObjectName(nullptr),
    dumpObject(nullptr),
    isOutOfMemory(false)
#ifdef PROFILE_RECYCLER_ALLOC
    , dumpObjectTypeInfo(nullptr)
#endif
{
    recycler->objectGraphDumper = this;
}